

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

bool __thiscall
QtPrivate::QCalendarTextNavigator::eventFilter(QCalendarTextNavigator *this,QObject *o,QEvent *e)

{
  byte bVar1;
  undefined1 uVar2;
  char cVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_widget != (QWidget *)0x0) && ((*(ushort *)(e + 8) & 0xfffe) == 6)) {
    local_40.d = *(Data **)(e + 0x28);
    local_40.ptr = *(char16_t **)(e + 0x30);
    local_40.size = *(qsizetype *)(e + 0x38);
    if (local_40.d != (Data *)0x0) {
      LOCK();
      ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_40.size == 0) {
      bVar1 = this->m_dateFrame != (QFrame *)0x0;
    }
    else {
      local_58.d = *(Data **)(e + 0x28);
      local_58.ptr = *(char16_t **)(e + 0x30);
      local_58.size = *(qsizetype *)(e + 0x38);
      if (local_58.d != (Data *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      bVar1 = QChar::isPrint((uint)(ushort)*local_58.ptr);
      bVar1 = this->m_dateFrame != (QFrame *)0x0 | bVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (bVar1 != 0) {
      if ((*(int *)(e + 0x40) + 0xfefffffcU < 2) || (*(int *)(e + 0x40) == 0x1010000)) {
        applyDate(this);
        editingFinished(this);
LAB_003a40cc:
        removeDateLabel(this);
      }
      else {
        cVar3 = QKeyEvent::matches((StandardKey)e);
        if (cVar3 != '\0') goto LAB_003a40cc;
        if (*(short *)(e + 8) == 6) {
          createDateLabel(this);
          QCalendarDateValidator::handleKeyEvent
                    (this->m_dateValidator,e,*(undefined8 *)&this->m_calendar);
          updateDateLabel(this);
        }
      }
      e[0xc] = (QEvent)0x1;
      uVar2 = 1;
      goto LAB_003a40ea;
    }
  }
  uVar2 = QObject::eventFilter(&this->super_QObject,(QEvent *)o);
LAB_003a40ea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QCalendarTextNavigator::eventFilter(QObject *o, QEvent *e)
{
    if (m_widget) {
        if (e->type() == QEvent::KeyPress || e->type() == QEvent::KeyRelease) {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if ((ke->text().size() > 0 && ke->text().at(0).isPrint()) || m_dateFrame) {
                if (ke->key() == Qt::Key_Return || ke->key() == Qt::Key_Enter || ke->key() == Qt::Key_Select) {
                    applyDate();
                    emit editingFinished();
                    removeDateLabel();
#if QT_CONFIG(shortcut)
                } else if (ke->matches(QKeySequence::Cancel)) {
                    removeDateLabel();
#endif
                } else if (e->type() == QEvent::KeyPress) {
                    createDateLabel();
                    m_dateValidator->handleKeyEvent(ke, m_calendar);
                    updateDateLabel();
                }
                ke->accept();
                return true;
            }
            // If we are navigating let the user finish his date in old locate.
            // If we change our mind and want it to update immediately simply uncomment below
            /*
        } else if (e->type() == QEvent::LocaleChange) {
            if (m_dateValidator) {
                m_dateValidator->setLocale(m_widget->locale());
                m_dateValidator->setFormat(m_widget->locale().dateFormat(QLocale::ShortFormat));
                updateDateLabel();
            }
            */
        }
    }
    return QObject::eventFilter(o,e);
}